

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorldImporter.cpp
# Opt level: O2

cbtCollisionShape * __thiscall
cbtCollisionWorldImporter::convertCollisionShape
          (cbtCollisionWorldImporter *this,cbtCollisionShapeData *shapeData)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined8 uVar4;
  float fVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long *plVar13;
  cbtOptimizedBvh **ppcVar14;
  cbtOptimizedBvh *pcVar15;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  cbtCollisionShape *pcVar16;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  _func_int **pp_Var17;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  cbtStaticPlaneShapeData *planeData;
  long lVar18;
  cbtAlignedObjectArray<cbtVector3> *this_00;
  char *pcVar19;
  cbtCapsuleShape *cap;
  cbtConvexHullShape *pcVar20;
  int i;
  long lVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  cbtVector3 implicitShapeDimensions;
  cbtAlignedObjectArray<float> radii;
  cbtAlignedObjectArray<cbtVector3> tmpPos;
  cbtVector3 localScaling;
  cbtVector3 local_40;
  undefined3 uVar7;
  undefined2 uVar9;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  
  iVar12 = shapeData->m_shapeType;
  pcVar20 = (cbtConvexHullShape *)0x0;
  switch(iVar12) {
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0x14:
switchD_00de607b_caseD_8:
    cbtVector3::deSerializeFloat(&implicitShapeDimensions,(cbtVector3FloatData *)(shapeData + 2));
    cbtVector3::deSerializeFloat(&localScaling,(cbtVector3FloatData *)(shapeData + 1));
    fVar2 = *(float *)&shapeData[3].m_name;
    switch(shapeData->m_shapeType) {
    case 0:
      auVar23._4_4_ = implicitShapeDimensions.m_floats[1];
      auVar23._0_4_ = implicitShapeDimensions.m_floats[0];
      auVar23._8_8_ = 0;
      auVar25._8_8_ = 0;
      auVar25._0_4_ = localScaling.m_floats[0];
      auVar25._4_4_ = localScaling.m_floats[1];
      auVar23 = vdivps_avx(auVar23,auVar25);
      auVar24._0_4_ = fVar2 + auVar23._0_4_;
      auVar24._4_4_ = fVar2 + auVar23._4_4_;
      auVar24._8_4_ = fVar2 + auVar23._8_4_;
      auVar24._12_4_ = fVar2 + auVar23._12_4_;
      tmpPos._0_16_ =
           vinsertps_avx(auVar24,ZEXT416((uint)(fVar2 + implicitShapeDimensions.m_floats[2] /
                                                        localScaling.m_floats[2])),0x28);
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[5])(this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var,iVar12);
      break;
    case 1:
    case 2:
    case 3:
    case 5:
    case 6:
    case 7:
    case 10:
    case 0xc:
switchD_00de60bf_caseD_1:
      printf("error: cannot create shape type (%d)\n");
      return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
    case 4:
      uVar3 = shapeData[4].m_shapeType;
      tmpPos.m_ownsMemory = true;
      tmpPos.m_data = (cbtVector3 *)0x0;
      tmpPos.m_size = 0;
      tmpPos.m_capacity = 0;
      cbtAlignedObjectArray<cbtVector3>::resize(&tmpPos,uVar3,(cbtVector3 *)&radii);
      lVar21 = 0;
      uVar22 = (ulong)(~((int)uVar3 >> 0x1f) & uVar3);
      for (lVar18 = 0; uVar22 << 5 != lVar18; lVar18 = lVar18 + 0x20) {
        if (*(long *)&shapeData[3].m_shapeType != 0) {
          cbtVector3::deSerialize
                    ((cbtVector3 *)((long)(tmpPos.m_data)->m_floats + lVar21),
                     (cbtVector3FloatData *)(*(long *)&shapeData[3].m_shapeType + lVar21));
        }
        if (shapeData[4].m_name != (char *)0x0) {
          cbtVector3::deSerializeDouble
                    ((cbtVector3 *)((long)(tmpPos.m_data)->m_floats + lVar21),
                     (cbtVector3DoubleData *)(shapeData[4].m_name + lVar18));
        }
        lVar21 = lVar21 + 0x10;
      }
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x15])(this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_11,iVar12);
      for (lVar18 = 0; uVar22 << 4 != lVar18; lVar18 = lVar18 + 0x10) {
        cbtConvexHullShape::addPoint
                  (pcVar20,(cbtVector3 *)((long)(tmpPos.m_data)->m_floats + lVar18),true);
      }
      (*(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])((ulong)*(uint *)&shapeData[3].m_name,pcVar20);
      cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&tmpPos);
      goto LAB_00de65ad;
    case 8:
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[6])
                         ((ulong)(uint)implicitShapeDimensions.m_floats[0],this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_08,iVar12);
      break;
    case 9:
      uVar3 = *(uint *)&shapeData[4].m_name;
      tmpPos.m_ownsMemory = true;
      tmpPos.m_data = (cbtVector3 *)0x0;
      radii.m_ownsMemory = true;
      radii.m_data = (float *)0x0;
      tmpPos.m_size = 0;
      tmpPos.m_capacity = 0;
      radii.m_size = 0;
      radii.m_capacity = 0;
      local_40.m_floats[0] = 0.0;
      cbtAlignedObjectArray<float>::resize(&radii,uVar3,local_40.m_floats);
      cbtAlignedObjectArray<cbtVector3>::resize(&tmpPos,uVar3,&local_40);
      lVar18 = 0;
      lVar21 = 0;
      for (uVar22 = 0; (~((int)uVar3 >> 0x1f) & uVar3) != uVar22; uVar22 = uVar22 + 1) {
        cbtVector3::deSerializeFloat
                  ((cbtVector3 *)((long)(tmpPos.m_data)->m_floats + lVar21),
                   (cbtVector3FloatData *)(*(long *)&shapeData[3].m_shapeType + lVar18));
        lVar21 = lVar21 + 0x10;
        pfVar1 = (float *)(*(long *)&shapeData[3].m_shapeType + 0x10 + lVar18);
        lVar18 = lVar18 + 0x14;
        radii.m_data[uVar22] = *pfVar1;
      }
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x18])
                         (this,tmpPos.m_data,radii.m_data,(ulong)uVar3);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_12,iVar12);
      cbtAlignedObjectArray<float>::~cbtAlignedObjectArray(&radii);
      cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&tmpPos);
      break;
    case 0xb:
      iVar12 = shapeData[3].m_shapeType;
      if (iVar12 == 2) {
        iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x10])
                           ((ulong)(uint)implicitShapeDimensions.m_floats[0],
                            (ulong)(uint)implicitShapeDimensions.m_floats[2],this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_19,iVar12);
      }
      else if (iVar12 == 1) {
        iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0xf])
                           ((ulong)(uint)implicitShapeDimensions.m_floats[0],
                            (ulong)(uint)implicitShapeDimensions.m_floats[1],this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_18,iVar12);
      }
      else {
        if (iVar12 != 0) {
          pcVar19 = "unknown Cone up axis";
          goto LAB_00de66f2;
        }
        iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0xe])
                           ((ulong)(uint)implicitShapeDimensions.m_floats[1],
                            (ulong)(uint)implicitShapeDimensions.m_floats[0],this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_10,iVar12);
      }
      break;
    case 0xd:
      fVar11 = fVar2 + implicitShapeDimensions.m_floats[0];
      iVar12 = shapeData[3].m_shapeType;
      if (iVar12 == 2) {
        iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0xc])
                           ((ulong)(uint)fVar11,
                            (ulong)(uint)(fVar2 + implicitShapeDimensions.m_floats[2]),this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_17,iVar12);
      }
      else if (iVar12 == 1) {
        iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0xb])
                           ((ulong)(uint)fVar11,
                            (ulong)(uint)(fVar2 + implicitShapeDimensions.m_floats[1]),this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_16,iVar12);
      }
      else {
        if (iVar12 != 0) {
          pcVar19 = "unknown Cylinder up axis";
          goto LAB_00de66f2;
        }
        iVar12 = (*this->_vptr_cbtCollisionWorldImporter[10])
                           ((ulong)(uint)(fVar2 + implicitShapeDimensions.m_floats[1]),
                            (ulong)(uint)fVar11,this);
        pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_09,iVar12);
      }
      break;
    default:
      if (shapeData->m_shapeType != 0x14) goto switchD_00de60bf_caseD_1;
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0xd])
                         ((ulong)(uint)(fVar2 + implicitShapeDimensions.m_floats[0]),
                          (ulong)(uint)(fVar2 + implicitShapeDimensions.m_floats[1]),this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_01,iVar12);
    }
    if (pcVar20 != (cbtConvexHullShape *)0x0) {
LAB_00de65ad:
      (*(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])((ulong)*(uint *)&shapeData[3].m_name,pcVar20);
      this_00 = &tmpPos;
      cbtVector3::deSerializeFloat((cbtVector3 *)this_00,(cbtVector3FloatData *)(shapeData + 1));
      pp_Var17 = (pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape
                 .super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
                 _vptr_cbtCollisionShape;
      goto LAB_00de65d6;
    }
    break;
  case 10:
    if ((ulong)(uint)shapeData[3].m_shapeType < 3) {
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[(ulong)(uint)shapeData[3].m_shapeType + 7])
                         (0x3f800000,0x3f800000,this);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_06,iVar12);
      if (pcVar20 != (cbtConvexHullShape *)0x0) {
        cbtCapsuleShape::deSerializeFloat
                  ((cbtCapsuleShape *)pcVar20,(cbtCapsuleShapeData *)shapeData);
        return (cbtCollisionShape *)pcVar20;
      }
    }
    else {
      pcVar19 = "error: wrong up axis for cbtCapsuleShape";
LAB_00de66f2:
      puts(pcVar19);
    }
    break;
  case 0xc:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
    goto switchD_00de607b_caseD_c;
  case 0x19:
    iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x14])(this,shapeData + 1);
    iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x19])(this,CONCAT44(extraout_var_02,iVar12));
    plVar13 = (long *)CONCAT44(extraout_var_03,iVar12);
    iVar12 = (**(code **)(*plVar13 + 0x38))(plVar13);
    if (iVar12 != 0) {
      cbtVector3::deSerializeFloat
                ((cbtVector3 *)&tmpPos,(cbtVector3FloatData *)&shapeData[1].m_shapeType);
      plVar13[1] = tmpPos._0_8_;
      plVar13[2] = tmpPos._8_8_;
      pcVar19 = shapeData[3].m_name;
      if (pcVar19 == (char *)0x0) {
        pcVar15 = (cbtOptimizedBvh *)0x0;
      }
      else {
        radii._0_4_ = SUB84(pcVar19,0);
        radii.m_size = (int)((ulong)pcVar19 >> 0x20);
        ppcVar14 = cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::find
                             (&this->m_bvhMap,(cbtHashPtr *)&radii);
        if ((ppcVar14 == (cbtOptimizedBvh **)0x0) ||
           (pcVar15 = *ppcVar14, pcVar15 == (cbtOptimizedBvh *)0x0)) {
          iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
          pcVar15 = (cbtOptimizedBvh *)CONCAT44(extraout_var_04,iVar12);
          (*(pcVar15->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[5])(pcVar15,shapeData[3].m_name);
        }
      }
      lVar18._0_4_ = shapeData[3].m_shapeType;
      uVar5 = shapeData[3].m_padding[0];
      uVar6 = shapeData[3].m_padding[1];
      uVar8 = shapeData[3].m_padding[2];
      uVar10 = shapeData[3].m_padding[3];
      uVar9 = CONCAT11(uVar10,uVar8);
      uVar7 = CONCAT21(uVar9,uVar6);
      lVar18._4_4_ = CONCAT31(uVar7,uVar5);
      if (lVar18 != 0) {
        radii._0_4_ = (undefined4)lVar18;
        radii.m_size = lVar18._4_4_;
        ppcVar14 = cbtHashMap<cbtHashPtr,_cbtOptimizedBvh_*>::find
                             (&this->m_bvhMap,(cbtHashPtr *)&radii);
        if ((ppcVar14 == (cbtOptimizedBvh **)0x0) ||
           (pcVar15 = *ppcVar14, pcVar15 == (cbtOptimizedBvh *)0x0)) {
          iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x1a])(this);
          pcVar15 = (cbtOptimizedBvh *)CONCAT44(extraout_var_13,iVar12);
          uVar4._0_4_ = shapeData[3].m_shapeType;
          uVar4._4_1_ = shapeData[3].m_padding[0];
          uVar4._5_1_ = shapeData[3].m_padding[1];
          uVar4._6_1_ = shapeData[3].m_padding[2];
          uVar4._7_1_ = shapeData[3].m_padding[3];
          (*(pcVar15->super_cbtQuantizedBvh)._vptr_cbtQuantizedBvh[6])(pcVar15,uVar4);
        }
      }
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x12])(this,plVar13,pcVar15);
      pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_14,iVar12);
      (*(pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
        super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])((ulong)(uint)shapeData[4].m_shapeType,pcVar20);
      if (shapeData[4].m_name == (char *)0x0) {
        return (cbtCollisionShape *)pcVar20;
      }
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x1b])(this);
      cbtTriangleInfoMap::deSerialize
                ((cbtTriangleInfoMap *)CONCAT44(extraout_var_15,iVar12),
                 (cbtTriangleInfoMapData *)shapeData[4].m_name);
      *(cbtTriangleInfoMap **)
       (pcVar20->super_cbtPolyhedralConvexAabbCachingShape).m_localAabbMin.m_floats =
           (cbtTriangleInfoMap *)CONCAT44(extraout_var_15,iVar12);
      return (cbtCollisionShape *)pcVar20;
    }
    break;
  case 0x1a:
    shapeData->m_shapeType = 0x19;
    pcVar16 = convertCollisionShape(this,shapeData);
    cbtVector3::deSerializeFloat((cbtVector3 *)&tmpPos,(cbtVector3FloatData *)(shapeData + 5));
    iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x17])(this,pcVar16,&tmpPos);
    return (cbtCollisionShape *)(cbtConvexHullShape *)CONCAT44(extraout_var_05,iVar12);
  default:
    if ((iVar12 == 0) || (iVar12 == 4)) goto switchD_00de607b_caseD_8;
    if (iVar12 == 0x25) {
      iVar12 = (*this->_vptr_cbtCollisionWorldImporter[0x16])(this);
      radii.m_ownsMemory = true;
      radii.m_data = (float *)0x0;
      radii.m_size = 0;
      radii.m_capacity = 0;
      lVar18 = 0;
      for (lVar21 = 0; lVar21 < shapeData[1].m_shapeType; lVar21 = lVar21 + 1) {
        pcVar16 = convertCollisionShape
                            (this,*(cbtCollisionShapeData **)(shapeData[1].m_name + lVar18 + 0x40));
        if (pcVar16 != (cbtCollisionShape *)0x0) {
          cbtTransform::deSerializeFloat
                    ((cbtTransform *)&tmpPos,(cbtTransformFloatData *)(shapeData[1].m_name + lVar18)
                    );
          cbtCompoundShape::addChildShape
                    ((cbtCompoundShape *)CONCAT44(extraout_var_07,iVar12),(cbtTransform *)&tmpPos,
                     pcVar16);
        }
        lVar18 = lVar18 + 0x50;
      }
      cbtAlignedObjectArray<cbtCollisionShape_*>::~cbtAlignedObjectArray
                ((cbtAlignedObjectArray<cbtCollisionShape_*> *)&radii);
      return (cbtCollisionShape *)(cbtConvexHullShape *)CONCAT44(extraout_var_07,iVar12);
    }
    if (iVar12 != 0x22) {
      return (cbtCollisionShape *)(cbtConvexHullShape *)0x0;
    }
    cbtVector3::deSerializeFloat((cbtVector3 *)&tmpPos,(cbtVector3FloatData *)(shapeData + 2));
    this_00 = (cbtAlignedObjectArray<cbtVector3> *)&radii;
    cbtVector3::deSerializeFloat((cbtVector3 *)this_00,(cbtVector3FloatData *)(shapeData + 1));
    iVar12 = (*this->_vptr_cbtCollisionWorldImporter[4])
                       ((ulong)*(uint *)&shapeData[3].m_name,this,&tmpPos);
    pcVar20 = (cbtConvexHullShape *)CONCAT44(extraout_var_00,iVar12);
    pp_Var17 = (pcVar20->super_cbtPolyhedralConvexAabbCachingShape).super_cbtPolyhedralConvexShape.
               super_cbtConvexInternalShape.super_cbtConvexShape.super_cbtCollisionShape.
               _vptr_cbtCollisionShape;
LAB_00de65d6:
    (*pp_Var17[6])(pcVar20,this_00);
    goto switchD_00de607b_caseD_c;
  }
  pcVar20 = (cbtConvexHullShape *)0x0;
switchD_00de607b_caseD_c:
  return (cbtCollisionShape *)pcVar20;
}

Assistant:

cbtCollisionShape* cbtCollisionWorldImporter::convertCollisionShape(cbtCollisionShapeData* shapeData)
{
	cbtCollisionShape* shape = 0;

	switch (shapeData->m_shapeType)
	{
		case STATIC_PLANE_PROXYTYPE:
		{
			cbtStaticPlaneShapeData* planeData = (cbtStaticPlaneShapeData*)shapeData;
			cbtVector3 planeNormal, localScaling;
			planeNormal.deSerializeFloat(planeData->m_planeNormal);
			localScaling.deSerializeFloat(planeData->m_localScaling);
			shape = createPlaneShape(planeNormal, planeData->m_planeConstant);
			shape->setLocalScaling(localScaling);

			break;
		}
		case SCALED_TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			cbtScaledTriangleMeshShapeData* scaledMesh = (cbtScaledTriangleMeshShapeData*)shapeData;
			cbtCollisionShapeData* colShapeData = (cbtCollisionShapeData*)&scaledMesh->m_trimeshShapeData;
			colShapeData->m_shapeType = TRIANGLE_MESH_SHAPE_PROXYTYPE;
			cbtCollisionShape* childShape = convertCollisionShape(colShapeData);
			cbtBvhTriangleMeshShape* meshShape = (cbtBvhTriangleMeshShape*)childShape;
			cbtVector3 localScaling;
			localScaling.deSerializeFloat(scaledMesh->m_localScaling);

			shape = createScaledTrangleMeshShape(meshShape, localScaling);
			break;
		}
#ifdef SUPPORT_GIMPACT_SHAPE_IMPORT
		case GIMPACT_SHAPE_PROXYTYPE:
		{
			cbtGImpactMeshShapeData* gimpactData = (cbtGImpactMeshShapeData*)shapeData;
			if (gimpactData->m_gimpactSubType == CONST_GIMPACT_TRIMESH_SHAPE)
			{
				cbtStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&gimpactData->m_meshInterface);
				cbtTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);

				cbtGImpactMeshShape* gimpactShape = createGimpactShape(meshInterface);
				cbtVector3 localScaling;
				localScaling.deSerializeFloat(gimpactData->m_localScaling);
				gimpactShape->setLocalScaling(localScaling);
				gimpactShape->setMargin(cbtScalar(gimpactData->m_collisionMargin));
				gimpactShape->updateBound();
				shape = gimpactShape;
			}
			else
			{
				printf("unsupported gimpact sub type\n");
			}
			break;
		}
#endif  //SUPPORT_GIMPACT_SHAPE_IMPORT                                                                        \
		//The cbtCapsuleShape* API has issue passing the margin/scaling/halfextents unmodified through the API \
		//so deal with this
		case CAPSULE_SHAPE_PROXYTYPE:
		{
			cbtCapsuleShapeData* capData = (cbtCapsuleShapeData*)shapeData;

			switch (capData->m_upAxis)
			{
				case 0:
				{
					shape = createCapsuleShapeX(1, 1);
					break;
				}
				case 1:
				{
					shape = createCapsuleShapeY(1, 1);
					break;
				}
				case 2:
				{
					shape = createCapsuleShapeZ(1, 1);
					break;
				}
				default:
				{
					printf("error: wrong up axis for cbtCapsuleShape\n");
				}
			};
			if (shape)
			{
				cbtCapsuleShape* cap = (cbtCapsuleShape*)shape;
				cap->deSerializeFloat(capData);
			}
			break;
		}
		case CYLINDER_SHAPE_PROXYTYPE:
        case CYLSHELL_SHAPE_PROXYTYPE:
		case CONE_SHAPE_PROXYTYPE:
		case BOX_SHAPE_PROXYTYPE:
		case SPHERE_SHAPE_PROXYTYPE:
		case MULTI_SPHERE_SHAPE_PROXYTYPE:
		case CONVEX_HULL_SHAPE_PROXYTYPE:
		{
			cbtConvexInternalShapeData* bsd = (cbtConvexInternalShapeData*)shapeData;
			cbtVector3 implicitShapeDimensions;
			implicitShapeDimensions.deSerializeFloat(bsd->m_implicitShapeDimensions);
			cbtVector3 localScaling;
			localScaling.deSerializeFloat(bsd->m_localScaling);
			cbtVector3 margin(bsd->m_collisionMargin, bsd->m_collisionMargin, bsd->m_collisionMargin);
			switch (shapeData->m_shapeType)
			{
				case BOX_SHAPE_PROXYTYPE:
				{
					cbtBoxShape* box = (cbtBoxShape*)createBoxShape(implicitShapeDimensions / localScaling + margin);
					//box->initializePolyhedralFeatures();
					shape = box;

					break;
				}
				case SPHERE_SHAPE_PROXYTYPE:
				{
					shape = createSphereShape(implicitShapeDimensions.getX());
					break;
				}

				case CYLINDER_SHAPE_PROXYTYPE:
				{
					cbtCylinderShapeData* cylData = (cbtCylinderShapeData*)shapeData;
					cbtVector3 halfExtents = implicitShapeDimensions + margin;
					switch (cylData->m_upAxis)
					{
						case 0:
						{
							shape = createCylinderShapeX(halfExtents.getY(), halfExtents.getX());
							break;
						}
						case 1:
						{
							shape = createCylinderShapeY(halfExtents.getX(), halfExtents.getY());
							break;
						}
						case 2:
						{
							shape = createCylinderShapeZ(halfExtents.getX(), halfExtents.getZ());
							break;
						}
						default:
						{
							printf("unknown Cylinder up axis\n");
						}
					};

					break;
				}

                case CYLSHELL_SHAPE_PROXYTYPE: { /* ***CHRONO*** */
                    ////cbtCylindricalShellShapeData* cylData = (cbtCylindricalShellShapeData*)shapeData;
                    cbtVector3 halfExtents = implicitShapeDimensions + margin;
                    cbtScalar radius = halfExtents.getX();
                    cbtScalar hlen = halfExtents.getY();
					shape = createCylindricalShellShape(radius, hlen);

                    break;
                }

				case CONE_SHAPE_PROXYTYPE:
				{
					cbtConeShapeData* conData = (cbtConeShapeData*)shapeData;
					cbtVector3 halfExtents = implicitShapeDimensions;  //+margin;
					switch (conData->m_upIndex)
					{
						case 0:
						{
							shape = createConeShapeX(halfExtents.getY(), halfExtents.getX());
							break;
						}
						case 1:
						{
							shape = createConeShapeY(halfExtents.getX(), halfExtents.getY());
							break;
						}
						case 2:
						{
							shape = createConeShapeZ(halfExtents.getX(), halfExtents.getZ());
							break;
						}
						default:
						{
							printf("unknown Cone up axis\n");
						}
					};

					break;
				}
				case MULTI_SPHERE_SHAPE_PROXYTYPE:
				{
					cbtMultiSphereShapeData* mss = (cbtMultiSphereShapeData*)bsd;
					int numSpheres = mss->m_localPositionArraySize;

					cbtAlignedObjectArray<cbtVector3> tmpPos;
					cbtAlignedObjectArray<cbtScalar> radii;
					radii.resize(numSpheres);
					tmpPos.resize(numSpheres);
					int i;
					for (i = 0; i < numSpheres; i++)
					{
						tmpPos[i].deSerializeFloat(mss->m_localPositionArrayPtr[i].m_pos);
						radii[i] = mss->m_localPositionArrayPtr[i].m_radius;
					}
					shape = createMultiSphereShape(&tmpPos[0], &radii[0], numSpheres);
					break;
				}
				case CONVEX_HULL_SHAPE_PROXYTYPE:
				{
					//	int sz = sizeof(cbtConvexHullShapeData);
					//	int sz2 = sizeof(cbtConvexInternalShapeData);
					//	int sz3 = sizeof(cbtCollisionShapeData);
					cbtConvexHullShapeData* convexData = (cbtConvexHullShapeData*)bsd;
					int numPoints = convexData->m_numUnscaledPoints;

					cbtAlignedObjectArray<cbtVector3> tmpPoints;
					tmpPoints.resize(numPoints);
					int i;
					for (i = 0; i < numPoints; i++)
					{
#ifdef BT_USE_DOUBLE_PRECISION
						if (convexData->m_unscaledPointsDoublePtr)
							tmpPoints[i].deSerialize(convexData->m_unscaledPointsDoublePtr[i]);
						if (convexData->m_unscaledPointsFloatPtr)
							tmpPoints[i].deSerializeFloat(convexData->m_unscaledPointsFloatPtr[i]);
#else
						if (convexData->m_unscaledPointsFloatPtr)
							tmpPoints[i].deSerialize(convexData->m_unscaledPointsFloatPtr[i]);
						if (convexData->m_unscaledPointsDoublePtr)
							tmpPoints[i].deSerializeDouble(convexData->m_unscaledPointsDoublePtr[i]);
#endif  //BT_USE_DOUBLE_PRECISION
					}
					cbtConvexHullShape* hullShape = createConvexHullShape();
					for (i = 0; i < numPoints; i++)
					{
						hullShape->addPoint(tmpPoints[i]);
					}
					hullShape->setMargin(bsd->m_collisionMargin);
					//hullShape->initializePolyhedralFeatures();
					shape = hullShape;
					break;
				}
				default:
				{
					printf("error: cannot create shape type (%d)\n", shapeData->m_shapeType);
				}
			}

			if (shape)
			{
				shape->setMargin(bsd->m_collisionMargin);

				cbtVector3 localScaling;
				localScaling.deSerializeFloat(bsd->m_localScaling);
				shape->setLocalScaling(localScaling);
			}
			break;
		}
		case TRIANGLE_MESH_SHAPE_PROXYTYPE:
		{
			cbtTriangleMeshShapeData* trimesh = (cbtTriangleMeshShapeData*)shapeData;
			cbtStridingMeshInterfaceData* interfaceData = createStridingMeshInterfaceData(&trimesh->m_meshInterface);
			cbtTriangleIndexVertexArray* meshInterface = createMeshInterface(*interfaceData);
			if (!meshInterface->getNumSubParts())
			{
				return 0;
			}

			cbtVector3 scaling;
			scaling.deSerializeFloat(trimesh->m_meshInterface.m_scaling);
			meshInterface->setScaling(scaling);

			cbtOptimizedBvh* bvh = 0;
#if 1
			if (trimesh->m_quantizedFloatBvh)
			{
				cbtOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedFloatBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				}
				else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeFloat(*trimesh->m_quantizedFloatBvh);
				}
			}
			if (trimesh->m_quantizedDoubleBvh)
			{
				cbtOptimizedBvh** bvhPtr = m_bvhMap.find(trimesh->m_quantizedDoubleBvh);
				if (bvhPtr && *bvhPtr)
				{
					bvh = *bvhPtr;
				}
				else
				{
					bvh = createOptimizedBvh();
					bvh->deSerializeDouble(*trimesh->m_quantizedDoubleBvh);
				}
			}
#endif

			cbtBvhTriangleMeshShape* trimeshShape = createBvhTriangleMeshShape(meshInterface, bvh);
			trimeshShape->setMargin(trimesh->m_collisionMargin);
			shape = trimeshShape;

			if (trimesh->m_triangleInfoMap)
			{
				cbtTriangleInfoMap* map = createTriangleInfoMap();
				map->deSerialize(*trimesh->m_triangleInfoMap);
				trimeshShape->setTriangleInfoMap(map);

#ifdef USE_INTERNAL_EDGE_UTILITY
				gContactAddedCallback = cbtAdjustInternalEdgeContactsCallback;
#endif  //USE_INTERNAL_EDGE_UTILITY
			}

			//printf("trimesh->m_collisionMargin=%f\n",trimesh->m_collisionMargin);
			break;
		}
		case COMPOUND_SHAPE_PROXYTYPE:
		{
			cbtCompoundShapeData* compoundData = (cbtCompoundShapeData*)shapeData;
			cbtCompoundShape* compoundShape = createCompoundShape();

			//cbtCompoundShapeChildData* childShapeDataArray = &compoundData->m_childShapePtr[0];

			cbtAlignedObjectArray<cbtCollisionShape*> childShapes;
			for (int i = 0; i < compoundData->m_numChildShapes; i++)
			{
				//cbtCompoundShapeChildData* ptr = &compoundData->m_childShapePtr[i];

				cbtCollisionShapeData* cd = compoundData->m_childShapePtr[i].m_childShape;

				cbtCollisionShape* childShape = convertCollisionShape(cd);
				if (childShape)
				{
					cbtTransform localTransform;
					localTransform.deSerializeFloat(compoundData->m_childShapePtr[i].m_transform);
					compoundShape->addChildShape(localTransform, childShape);
				}
				else
				{
#ifdef _DEBUG
					printf("error: couldn't create childShape for compoundShape\n");
#endif
				}
			}
			shape = compoundShape;

			break;
		}
		case SOFTBODY_SHAPE_PROXYTYPE:
		{
			return 0;
		}
		default:
		{
#ifdef _DEBUG
			printf("unsupported shape type (%d)\n", shapeData->m_shapeType);
#endif
		}
	}

	return shape;
}